

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_factory.hpp
# Opt level: O2

auto_ptr<iutest::Test> __thiscall
iutest::detail::iuFactory<iu_StringViewSplit_x_iutest_x_chain_conv_func_by_stl_str_Test<char16_t>_>
::Create(iuFactory<iu_StringViewSplit_x_iutest_x_chain_conv_func_by_stl_str_Test<char16_t>_> *this)

{
  iu_StringViewSplit_x_iutest_x_chain_conv_func_by_stl_str_Test<char16_t> *this_00;
  
  this_00 = (iu_StringViewSplit_x_iutest_x_chain_conv_func_by_stl_str_Test<char16_t> *)
            operator_new(0x30);
  (this_00->super_StringViewSplit<char16_t>).super_Test._vptr_Test = (_func_int **)0x0;
  (this_00->super_StringViewSplit<char16_t>).super_Test.test_info_ = (TestInfo *)0x0;
  (this_00->super_StringViewSplit<char16_t>).super_Test.m_test_info = (iuITestInfoMediator *)0x0;
  (this_00->super_StringViewSplit<char16_t>).super_Test.m_random.m_engine.m_v1 = 0;
  (this_00->super_StringViewSplit<char16_t>).super_Test.m_random.m_engine.m_v2 = 0;
  (this_00->super_StringViewSplit<char16_t>).super_Test.m_random.m_engine.m_v3 = 0;
  (this_00->super_StringViewSplit<char16_t>).super_Test.m_random.m_engine.m_v4 = 0;
  *(undefined8 *)&(this_00->super_StringViewSplit<char16_t>).super_Test.m_random_seed = 0;
  iu_StringViewSplit_x_iutest_x_chain_conv_func_by_stl_str_Test<char16_t>::
  iu_StringViewSplit_x_iutest_x_chain_conv_func_by_stl_str_Test(this_00);
  (this->super_iuFactoryBase)._vptr_iuFactoryBase = (_func_int **)this_00;
  return (auto_ptr<iutest::Test>)(Test *)this;
}

Assistant:

virtual auto_ptr<Test> Create() IUTEST_CXX_OVERRIDE
    {
        auto_ptr<Test> p( new Tester() );
        return p;
    }